

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePiece.cc
# Opt level: O2

vector<onmt::Token,_std::allocator<onmt::Token>_> * __thiscall
onmt::SentencePiece::encode_and_annotate
          (vector<onmt::Token,_std::allocator<onmt::Token>_> *__return_storage_ptr__,
          SentencePiece *this,Token *token,bool training)

{
  pointer pTVar1;
  pointer pTVar2;
  bool bVar3;
  undefined7 in_register_00000009;
  bool bVar4;
  pointer str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pieces;
  Token sub_token;
  string local_70;
  string local_50;
  
  (*(this->super_SubwordEncoder)._vptr_SubwordEncoder[6])
            (&pieces,this,token,CONCAT71(in_register_00000009,training));
  if (pieces.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      pieces.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::vector
              (__return_storage_ptr__,1,token,(allocator_type *)&sub_token);
  }
  else {
    (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::reserve
              (__return_storage_ptr__,
               (long)pieces.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)pieces.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    bVar4 = false;
    for (str = pieces.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        str != pieces.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; str = str + 1) {
      bVar3 = starts_with(str,(string *)sp_marker_abi_cxx11_);
      if (bVar3) {
        bVar3 = true;
        if (str->_M_string_length != sp_marker_abi_cxx11_._8_8_) {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
          Token::Token(&sub_token,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          sub_token.spacer = true;
          std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
                    (__return_storage_ptr__,&sub_token);
          Token::~Token(&sub_token);
          bVar3 = bVar4;
        }
      }
      else {
        std::__cxx11::string::string((string *)&local_70,(string *)str);
        Token::Token(&sub_token,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        if (bVar4) {
          sub_token.spacer = true;
          sub_token.preserve = true;
        }
        else if ((__return_storage_ptr__->
                 super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                 super__Vector_impl_data._M_start !=
                 (__return_storage_ptr__->
                 super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
                 super__Vector_impl_data._M_finish) {
          sub_token.join_left = true;
        }
        std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
                  (__return_storage_ptr__,&sub_token);
        Token::~Token(&sub_token);
        bVar3 = false;
      }
      bVar4 = bVar3;
    }
    pTVar1 = (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (__return_storage_ptr__->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = token->join_left;
    pTVar1->join_left = bVar4;
    bVar3 = token->join_right;
    pTVar2[-1].join_right = bVar3;
    if ((bVar4 != false) && (token->preserve == true)) {
      pTVar1->preserve = true;
    }
    if ((bVar3 != false) && (token->preserve == true)) {
      pTVar2[-1].preserve = true;
    }
    SubwordEncoder::propagate_token_properties(token,__return_storage_ptr__);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pieces);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token> SentencePiece::encode_and_annotate(const Token& token, bool training) const
  {
    std::vector<std::string> pieces = encode(token.surface, training);

    // SentencePiece sometimes returns no pieces for a non empty input. In this case
    // we simply return the original token.
    if (pieces.empty())
      return std::vector<Token>(1, token);

    std::vector<Token> tokens;
    tokens.reserve(pieces.size());
    bool apply_spacer_on_next = false;

    for (auto& piece : pieces)
    {
      // Prefixed by the spacer.
      if (starts_with(piece, sp_marker))
      {
        if (piece.length() == sp_marker.length())  // Piece is just the spacer.
        {
          // Skip this isolated spacer and mark the next piece with the spacer flag.
          apply_spacer_on_next = true;
          continue;
        }
        else
        {
          Token sub_token(piece.substr(sp_marker.length()));
          sub_token.spacer = true;
          tokens.emplace_back(std::move(sub_token));
        }
      }
      else
      {
        Token sub_token(std::move(piece));
        if (apply_spacer_on_next)
        {
          sub_token.spacer = true;
          sub_token.preserve = true;  // The spacer was not attached to this piece so preserve it.
          apply_spacer_on_next = false;
        }
        else if (!tokens.empty())
        {
          sub_token.join_left = true;  // No spacer means it should be joined with the previous subtoken.
        }
        tokens.emplace_back(std::move(sub_token));
      }
    }

    auto& first = tokens.front();
    auto& last = tokens.back();
    first.join_left = token.join_left;
    last.join_right = token.join_right;
    if (token.join_left && token.preserve)
      first.preserve = true;
    if (token.join_right && token.preserve)
      last.preserve = true;

    propagate_token_properties(token, tokens);
    return tokens;
  }